

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexReader.cpp
# Opt level: O0

void __thiscall Ptex::v2_2::PtexReader::readEditData(PtexReader *this)

{
  bool bVar1;
  FilePos FVar2;
  PtexReader *this_00;
  size_type sVar3;
  long lVar4;
  PtexReader *in_RDI;
  uint32_t editsize;
  uint8_t edittype;
  FilePos endpos;
  FilePos pos;
  FilePos in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  uint in_stack_ffffffffffffffd4;
  uint in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  PtexReader *this_01;
  
  this_00 = (PtexReader *)in_RDI->_editdatapos;
  if ((in_RDI->_extheader).editdatapos == 0) {
    this_01 = (PtexReader *)0xffffffffffffffff;
  }
  else {
    this_01 = (PtexReader *)
              ((long)&(this_00->super_PtexTexture)._vptr_PtexTexture +
              (in_RDI->_extheader).editdatasize);
  }
  while ((long)this_00 < (long)this_01) {
    seek((PtexReader *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
         in_stack_ffffffffffffffc8);
    in_stack_ffffffffffffffe4 = CONCAT13(1,(int3)in_stack_ffffffffffffffe4);
    bVar1 = readBlock(this_01,(void *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                      (int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
    if (((!bVar1) ||
        (bVar1 = readBlock(this_01,(void *)CONCAT44(in_stack_ffffffffffffffe4,
                                                    in_stack_ffffffffffffffe0),
                           (int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0)), !bVar1)) ||
       (in_stack_ffffffffffffffe0 == 0)) break;
    in_RDI->_hasEdits = true;
    FVar2 = tell(in_RDI);
    this_00 = (PtexReader *)(FVar2 + (ulong)in_stack_ffffffffffffffe0);
    in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffe4 >> 0x18;
    if (in_stack_ffffffffffffffd4 == 0) {
      readEditFaceData((PtexReader *)endpos);
    }
    else if (in_stack_ffffffffffffffd4 == 1) {
      readEditMetaData(this_00);
    }
  }
  sVar3 = std::
          vector<Ptex::v2_2::PtexReader::FaceEdit,_std::allocator<Ptex::v2_2::PtexReader::FaceEdit>_>
          ::capacity(&in_RDI->_faceedits);
  lVar4 = sVar3 << 4;
  sVar3 = std::
          vector<Ptex::v2_2::PtexReader::MetaEdit,_std::allocator<Ptex::v2_2::PtexReader::MetaEdit>_>
          ::capacity(&in_RDI->_metaedits);
  increaseMemUsed(in_RDI,lVar4 + sVar3 * 0x10);
  return;
}

Assistant:

void PtexReader::readEditData()
{
    // determine file range to scan for edits
    FilePos pos = FilePos(_editdatapos), endpos;
    if (_extheader.editdatapos > 0) {
        // newer files record the edit data position and size in the extheader
        // note: position will be non-zero even if size is zero
        endpos = FilePos(pos + _extheader.editdatasize);
    }
    else {
        // must have an older file, just read until EOF
        endpos = FilePos((uint64_t)-1);
    }

    while (pos < endpos) {
        seek(pos);
        // read the edit data header
        uint8_t edittype = et_editmetadata;
        uint32_t editsize;
        if (!readBlock(&edittype, sizeof(edittype), /*reporterror*/ false)) break;
        if (!readBlock(&editsize, sizeof(editsize), /*reporterror*/ false)) break;
        if (!editsize) break;
        _hasEdits = true;
        pos = tell() + editsize;
        switch (edittype) {
        case et_editfacedata:   readEditFaceData(); break;
        case et_editmetadata:   readEditMetaData(); break;
        }
    }
    increaseMemUsed(sizeof(_faceedits[0]) * _faceedits.capacity() +
                    sizeof(_metaedits[0]) * _metaedits.capacity());
}